

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubByteTypes.cpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> *
MILBlob::PackSubByteVecImpl<MILBlob::UInt1>(Span<const_unsigned_char,_18446744073709551615UL> vec)

{
  byte *pbVar1;
  byte *pbVar2;
  range_error *this;
  long *plVar3;
  size_type *psVar4;
  long *plVar5;
  ulong in_RDX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  ulong index;
  double dVar6;
  undefined1 auVar7 [16];
  Span<const_unsigned_char,_18446744073709551615UL> local_160;
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  auVar7._8_4_ = (int)(in_RDX >> 0x20);
  auVar7._0_8_ = in_RDX;
  auVar7._12_4_ = 0x45300000;
  local_160.m_size.m_size = in_RDX;
  dVar6 = ceil(((auVar7._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)in_RDX) - 4503599627370496.0)) * 0.125);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_RDI,(long)(dVar6 - 9.223372036854776e+18) & (long)dVar6 >> 0x3f | (long)dVar6,
             (allocator_type *)&local_150);
  if (local_160.m_size.m_size != 0) {
    index = 0;
    do {
      pbVar1 = Util::Span<const_unsigned_char,_18446744073709551615UL>::operator[](&local_160,index)
      ;
      if (1 < *pbVar1) {
        this = (range_error *)__cxa_allocate_exception(0x10);
        pbVar1 = Util::Span<const_unsigned_char,_18446744073709551615UL>::operator[]
                           (&local_160,index);
        std::__cxx11::to_string(&local_b0,(uint)*pbVar1);
        std::operator+(&local_90,"Value ",&local_b0);
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
        local_130._M_dataplus._M_p = (pointer)*plVar3;
        psVar4 = (size_type *)(plVar3 + 2);
        if ((size_type *)local_130._M_dataplus._M_p == psVar4) {
          local_130.field_2._M_allocated_capacity = *psVar4;
          local_130.field_2._8_8_ = plVar3[3];
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        }
        else {
          local_130.field_2._M_allocated_capacity = *psVar4;
        }
        local_130._M_string_length = plVar3[1];
        *plVar3 = (long)psVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::__cxx11::to_string(&local_d0,0);
        std::operator+(&local_70,&local_130,&local_d0);
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
        local_110._M_dataplus._M_p = (pointer)*plVar3;
        psVar4 = (size_type *)(plVar3 + 2);
        if ((size_type *)local_110._M_dataplus._M_p == psVar4) {
          local_110.field_2._M_allocated_capacity = *psVar4;
          local_110.field_2._8_8_ = plVar3[3];
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        }
        else {
          local_110.field_2._M_allocated_capacity = *psVar4;
        }
        local_110._M_string_length = plVar3[1];
        *plVar3 = (long)psVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::__cxx11::to_string(&local_f0,1);
        std::operator+(&local_50,&local_110,&local_f0);
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_150 = (long *)*plVar3;
        plVar5 = plVar3 + 2;
        if (local_150 == plVar5) {
          local_140 = *plVar5;
          lStack_138 = plVar3[3];
          local_150 = &local_140;
        }
        else {
          local_140 = *plVar5;
        }
        local_148 = plVar3[1];
        *plVar3 = (long)plVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::range_error::range_error(this,(string *)&local_150);
        __cxa_throw(this,&std::range_error::typeinfo,std::range_error::~range_error);
      }
      Util::Span<const_unsigned_char,_18446744073709551615UL>::operator[](&local_160,index);
      pbVar2 = Util::Span<const_unsigned_char,_18446744073709551615UL>::operator[](&local_160,index)
      ;
      pbVar1 = (in_RDI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start + (index >> 3);
      *pbVar1 = *pbVar1 | (*pbVar2 & 1) << ((byte)index & 7);
      index = index + 1;
    } while (index < local_160.m_size.m_size);
  }
  return in_RDI;
}

Assistant:

std::vector<uint8_t> PackSubByteVecImpl(Util::Span<const decltype(T::data)> vec)
{
    if constexpr (!MILBlob::SubByteIsByteAligned<T>()) {
        return PackSubByteVecForNonByteAligned<T>(vec);
    }
    const auto ElementsPerByte = 8 / T::SizeInBits;
    std::vector<uint8_t> ret(MILBlob::SizeInBytes<T>(vec.Size()));
    for (size_t i = 0; i < vec.Size(); i++) {
        size_t shiftAmmount = T::SizeInBits * (i % ElementsPerByte);
        MILVerifyIsTrue(vec[i] <= T::MAX && vec[i] >= T::MIN,
                        std::range_error,
                        "Value " + std::to_string(vec[i]) + " is outside allowed subbyte datatype range [" +
                            std::to_string(T::MIN) + ", " + std::to_string(T::MAX) + "].");
        ret[i / ElementsPerByte] |= (static_cast<uint8_t>((vec[i] & T::BitMask) << shiftAmmount));
    }
    return ret;
}